

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Adaptive_Bit_Model *M)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  bool bVar7;
  
  uVar2 = this->value;
  uVar6 = (this->length >> 0xd) * M->bit_0_prob;
  if (uVar2 < uVar6) {
    this->length = uVar6;
    M->bit_0_count = M->bit_0_count + 1;
    uVar3 = this->length;
  }
  else {
    this->value = uVar2 - uVar6;
    uVar3 = this->length - uVar6;
    this->length = uVar3;
  }
  if (uVar3 < 0x1000000) {
    uVar4 = this->value;
    pbVar5 = this->ac_pointer;
    do {
      pbVar5 = pbVar5 + 1;
      this->ac_pointer = pbVar5;
      uVar4 = uVar4 << 8 | (uint)*pbVar5;
      this->value = uVar4;
      this->length = uVar3 << 8;
      bVar7 = uVar3 < 0x10000;
      uVar3 = uVar3 << 8;
    } while (bVar7);
  }
  puVar1 = &M->bits_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    Adaptive_Bit_Model::update(M);
  }
  return (uint)(uVar6 <= uVar2);
}

Assistant:

unsigned Arithmetic_Codec::decode(Adaptive_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
      unsigned bit = (value >= x);                                     // decision
                                                                // update interval
      if (bit == 0) {
        length = x;
        ++M.bit_0_count;
      }
      else {
        value  -= x;
        length -= x;
      }

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      if (--M.bits_until_update == 0) M.update();         // periodic model update

      return bit;                                         // return data bit value
    }